

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::getPtr<wasm::SIMDLoad>
          (Replacer *this,SIMDLoad *curr,Index bytes)

{
  Function *func;
  Expression *local_98;
  Expression *local_90;
  LocalGet *local_88;
  initializer_list<wasm::Expression_*> local_80;
  uintptr_t local_70;
  LocalGet *local_68;
  Expression *ptrGet;
  Expression *boundsCheck;
  Expression *ptrSet;
  Index local_44;
  size_t sStack_40;
  Index ptrIdx;
  char *local_38;
  Replacer *local_30;
  Expression *ptrValue;
  SIMDLoad *pSStack_20;
  Index bytes_local;
  SIMDLoad *curr_local;
  Replacer *this_local;
  
  sStack_40 = (curr->memory).super_IString.str._M_len;
  local_38 = (curr->memory).super_IString.str._M_str;
  ptrValue._4_4_ = bytes;
  pSStack_20 = curr;
  curr_local = (SIMDLoad *)this;
  local_30 = (Replacer *)addOffsetGlobal(this,curr->ptr,(Name)(curr->memory).super_IString.str);
  this_local = local_30;
  if ((this->parent->checkBounds & 1U) != 0) {
    func = Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
           ::getFunction(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
                          ).
                          super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                          .
                          super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                        );
    ptrSet = (Expression *)(this->parent->pointerType).id;
    local_44 = Builder::addVar(func,(Type)ptrSet);
    boundsCheck = (Expression *)
                  Builder::makeLocalSet(&this->builder,local_44,(Expression *)local_30);
    ptrGet = makePtrBoundsCheck<wasm::SIMDLoad>(this,pSStack_20,local_44,ptrValue._4_4_);
    local_70 = (this->parent->pointerType).id;
    local_88 = Builder::makeLocalGet(&this->builder,local_44,(Type)local_70);
    local_98 = boundsCheck;
    local_90 = ptrGet;
    local_80._M_array = &local_98;
    local_80._M_len = 3;
    local_68 = local_88;
    this_local = (Replacer *)Builder::makeBlock(&this->builder,&local_80);
  }
  return (Expression *)this_local;
}

Assistant:

Expression* getPtr(T* curr, Index bytes) {
      Expression* ptrValue = addOffsetGlobal(curr->ptr, curr->memory);
      if (parent.checkBounds) {
        Index ptrIdx = Builder::addVar(getFunction(), parent.pointerType);
        Expression* ptrSet = builder.makeLocalSet(ptrIdx, ptrValue);
        Expression* boundsCheck = makePtrBoundsCheck(curr, ptrIdx, bytes);
        Expression* ptrGet = builder.makeLocalGet(ptrIdx, parent.pointerType);
        return builder.makeBlock({ptrSet, boundsCheck, ptrGet});
      }

      return ptrValue;
    }